

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

roaring_container_iterator_t
container_init_iterator(container_t *c,uint8_t typecode,uint16_t *value)

{
  ulong uVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  undefined7 in_register_00000031;
  
  iVar3 = (int)CONCAT71(in_register_00000031,typecode);
  if ((iVar3 == 3) || (iVar3 == 2)) {
    uVar5 = (uint)**(ushort **)((long)c + 8);
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    iVar3 = -0x40;
    do {
      uVar1 = *(ulong *)(*(ushort **)((long)c + 8) + (ulong)uVar4 * 4);
      uVar4 = uVar4 + 1;
      iVar3 = iVar3 + 0x40;
    } while (uVar1 == 0);
    lVar2 = 0;
    if (uVar1 != 0) {
      for (; (uVar1 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
      }
    }
    uVar5 = (int)lVar2 + iVar3;
    uVar4 = uVar5;
  }
  *value = (uint16_t)uVar5;
  return (roaring_container_iterator_t)uVar4;
}

Assistant:

roaring_container_iterator_t container_init_iterator(const container_t *c,
                                                     uint8_t typecode,
                                                     uint16_t *value) {
    switch (typecode) {
        case BITSET_CONTAINER_TYPE: {
            const bitset_container_t *bc = const_CAST_bitset(c);
            uint32_t wordindex = 0;
            uint64_t word;
            while ((word = bc->words[wordindex]) == 0) {
                wordindex++;
            }
            // word is non-zero
            int32_t index = wordindex * 64 + roaring_trailing_zeroes(word);
            *value = index;
            return ROARING_INIT_ROARING_CONTAINER_ITERATOR_T{
                .index = index,
            };
        }
        case ARRAY_CONTAINER_TYPE: {
            const array_container_t *ac = const_CAST_array(c);
            *value = ac->array[0];
            return ROARING_INIT_ROARING_CONTAINER_ITERATOR_T{
                .index = 0,
            };
        }
        case RUN_CONTAINER_TYPE: {
            const run_container_t *rc = const_CAST_run(c);
            *value = rc->runs[0].value;
            return ROARING_INIT_ROARING_CONTAINER_ITERATOR_T{
                .index = 0,
            };
        }
        default:
            assert(false);
            roaring_unreachable;
            return ROARING_INIT_ROARING_CONTAINER_ITERATOR_T{0};
    }
}